

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (MinTypMaxExpression *this,MonitorVisitor *visitor)

{
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->min_,visitor);
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->typ_,visitor);
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }